

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_streamable_read_header(archive_read *a,archive_entry *entry)

{
  wchar_t wVar1;
  void *pvVar2;
  long local_48;
  ssize_t bytes;
  char *end;
  char *p;
  int64_t skipped;
  zip *zip;
  archive_entry *entry_local;
  archive_read *a_local;
  
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  skipped = (int64_t)a->format->data;
  if (*(int *)(skipped + 0x30) == -1) {
    *(undefined4 *)(skipped + 0x30) = 0;
  }
  zip = (zip *)entry;
  entry_local = (archive_entry *)a;
  if (*(long *)(skipped + 0x38) == 0) {
    pvVar2 = malloc(0x90);
    *(void **)(skipped + 0x38) = pvVar2;
    if (*(long *)(skipped + 0x38) == 0) {
      archive_set_error((archive *)entry_local,0xc,"Out  of memory");
      return L'\xffffffe2';
    }
  }
  *(undefined8 *)(skipped + 0x68) = *(undefined8 *)(skipped + 0x38);
  memset(*(void **)(skipped + 0x68),0,0x90);
  if (*(char *)(skipped + 0x18c) != '\0') {
    aes_ctr_release((archive_crypto_ctx *)(skipped + 0x188));
  }
  if (*(char *)(skipped + 0x194) != '\0') {
    __hmac_sha1_cleanup((archive_hmac_sha1_ctx *)(skipped + 400));
  }
  *(undefined1 *)(skipped + 0x194) = 0;
  *(undefined1 *)(skipped + 0x18c) = 0;
  *(undefined1 *)(skipped + 0x184) = 0;
  __archive_read_reset_passphrase((archive_read *)entry_local);
  __archive_read_consume((archive_read *)entry_local,*(int64_t *)(skipped + 0x60));
  *(undefined8 *)(skipped + 0x60) = 0;
  do {
    p = (char *)0x0;
    end = (char *)__archive_read_ahead((archive_read *)entry_local,4,&local_48);
    if (end == (char *)0x0) {
      return L'\xffffffe2';
    }
    bytes = (ssize_t)(end + local_48);
    for (; end + 4 <= (ulong)bytes; end = end + 1) {
      if ((*end == 'P') && (end[1] == 'K')) {
        if ((end[2] == '\x03') && (end[3] == '\x04')) {
          __archive_read_consume((archive_read *)entry_local,(int64_t)p);
          wVar1 = zip_read_local_file_header
                            ((archive_read *)entry_local,(archive_entry *)zip,(zip *)skipped);
          return wVar1;
        }
        if ((end[2] == '\x01') && (end[3] == '\x02')) {
          return L'\x01';
        }
        if (((end[2] == '\x05') && (end[3] == '\x06')) || ((end[2] == '\x06' && (end[3] == '\x06')))
           ) {
          return L'\x01';
        }
      }
      p = p + 1;
    }
    __archive_read_consume((archive_read *)entry_local,(int64_t)p);
  } while( true );
}

Assistant:

static int
archive_read_format_zip_streamable_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct zip *zip;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	zip = (struct zip *)(a->format->data);

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	/* Make sure we have a zip_entry structure to use. */
	if (zip->zip_entries == NULL) {
		zip->zip_entries = malloc(sizeof(struct zip_entry));
		if (zip->zip_entries == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Out  of memory");
			return ARCHIVE_FATAL;
		}
	}
	zip->entry = zip->zip_entries;
	memset(zip->entry, 0, sizeof(struct zip_entry));

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* Search ahead for the next local file header. */
	__archive_read_consume(a, zip->unconsumed);
	zip->unconsumed = 0;
	for (;;) {
		int64_t skipped = 0;
		const char *p, *end;
		ssize_t bytes;

		p = __archive_read_ahead(a, 4, &bytes);
		if (p == NULL)
			return (ARCHIVE_FATAL);
		end = p + bytes;

		while (p + 4 <= end) {
			if (p[0] == 'P' && p[1] == 'K') {
				if (p[2] == '\003' && p[3] == '\004') {
					/* Regular file entry. */
					__archive_read_consume(a, skipped);
					return zip_read_local_file_header(a,
					    entry, zip);
				}

                              /*
                               * TODO: We cannot restore permissions
                               * based only on the local file headers.
                               * Consider scanning the central
                               * directory and returning additional
                               * entries for at least directories.
                               * This would allow us to properly set
                               * directory permissions.
			       *
			       * This won't help us fix symlinks
			       * and may not help with regular file
			       * permissions, either.  <sigh>
                               */
                              if (p[2] == '\001' && p[3] == '\002') {
                                      return (ARCHIVE_EOF);
                              }

                              /* End of central directory?  Must be an
                               * empty archive. */
                              if ((p[2] == '\005' && p[3] == '\006')
                                  || (p[2] == '\006' && p[3] == '\006'))
                                      return (ARCHIVE_EOF);
			}
			++p;
			++skipped;
		}
		__archive_read_consume(a, skipped);
	}
}